

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::Int(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
      *this,int i)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  char *pcVar3;
  uint32_t u;
  char *pcVar4;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  if (this_00->stackEnd_ <= this_00->stackTop_ + 0xb) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0xb);
  }
  pcVar1 = this_00->stackTop_;
  this_00->stackTop_ = pcVar1 + 0xb;
  pcVar4 = pcVar1;
  if (i < 0) {
    *pcVar1 = '-';
    i = -i;
    pcVar4 = pcVar1 + 1;
  }
  pcVar3 = internal::u32toa(i,pcVar4);
  pGVar2 = this->os_;
  pcVar4 = (pGVar2->stack_).stackTop_;
  if ((ulong)((long)pcVar4 - (long)(pGVar2->stack_).stack_) < ((long)pcVar1 - (long)pcVar3) + 0xbU)
  {
    __assert_fail("GetSize() >= count * sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/internal/stack.h"
                  ,0x71,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
                 );
  }
  (pGVar2->stack_).stackTop_ = pcVar4 + (-0xb - ((long)pcVar1 - (long)pcVar3));
  return true;
}

Assistant:

bool Int(int i)             { Prefix(kNumberType); return WriteInt(i); }